

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_spike.cpp
# Opt level: O0

int AF_A_ThrustImpale(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  FPortalGroupArray *this;
  AActor *origin;
  DObject *this_00;
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  int local_2b8;
  bool local_26e;
  bool local_26b;
  TAngle<double> local_268;
  FName local_25c;
  int local_258;
  TFlags<ActorFlag,_unsigned_int> local_254;
  int newdam;
  double blockdist;
  CheckResult cres;
  undefined1 local_210 [8];
  FMultiBlockThingsIterator it;
  FPortalGroupArray check;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                  ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                  ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  origin = *(AActor **)&param->field_0;
  local_26b = true;
  if (origin != (AActor *)0x0) {
    local_26b = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
  }
  if (local_26b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                  ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                    ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_26e = true;
    if (this_00 != (DObject *)0x0) {
      local_26e = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_26e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                    ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                    ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  this = (FPortalGroupArray *)(it.bbox.m_Box + 3);
  FPortalGroupArray::FPortalGroupArray(this,1);
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            ((FMultiBlockThingsIterator *)local_210,this,origin,-1.0,false);
  FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&blockdist);
LAB_007a887b:
  do {
    bVar2 = FMultiBlockThingsIterator::Next
                      ((FMultiBlockThingsIterator *)local_210,(CheckResult *)&blockdist);
    if (!bVar2) {
      FMultiBlockThingsIterator::~FMultiBlockThingsIterator((FMultiBlockThingsIterator *)local_210);
      FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(it.bbox.m_Box + 3));
      return 0;
    }
    _newdam = origin->radius + *(double *)((long)blockdist + 0x158);
    dVar3 = AActor::X((AActor *)blockdist);
  } while ((_newdam <= ABS(dVar3 - (double)cres.thing)) ||
          (dVar3 = AActor::Y((AActor *)blockdist), _newdam <= ABS(dVar3 - cres.Position.X)));
  dVar3 = AActor::Top((AActor *)blockdist);
  dVar4 = AActor::Z(origin);
  if (dVar3 < dVar4) goto LAB_007a89b2;
  dVar3 = AActor::Z((AActor *)blockdist);
  dVar4 = AActor::Top(origin);
  if (dVar4 < dVar3) goto LAB_007a89b2;
  goto LAB_007a89e0;
LAB_007a89b2:
  if (origin->Sector->PortalGroup == *(int *)(*(long *)((long)blockdist + 0x110) + 0x1f8)) {
LAB_007a89e0:
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_254,
               SUB84(blockdist,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_254);
    dVar3 = blockdist;
    if ((uVar1 != 0) && ((AActor *)blockdist != origin)) {
      FName::FName(&local_25c,NAME_Crush);
      TAngle<double>::TAngle(&local_268,0.0);
      local_258 = P_DamageMobj((AActor *)dVar3,origin,origin,0x2711,&local_25c,0,&local_268);
      local_2b8 = local_258;
      if (local_258 < 1) {
        local_2b8 = 0x2711;
      }
      P_TraceBleed(local_2b8,(AActor *)blockdist);
      origin->args[1] = 1;
    }
  }
  goto LAB_007a887b;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrustImpale)
{
	PARAM_ACTION_PROLOGUE;

	// This doesn't need to iterate through portals.

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, self);
	FMultiBlockThingsIterator::CheckResult cres;
	while (it.Next(&cres))
	{
		double blockdist = self->radius + cres.thing->radius;
		if (fabs(cres.thing->X() - cres.Position.X) >= blockdist || fabs(cres.thing->Y() - cres.Position.Y) >= blockdist)
			continue;

		// Q: Make this z-aware for everything? It never was before.
		if (cres.thing->Top() < self->Z() || cres.thing->Z() > self->Top())
		{
			if (self->Sector->PortalGroup != cres.thing->Sector->PortalGroup)
				continue;
		}

		if (!(cres.thing->flags & MF_SHOOTABLE) )
			continue;

		if (cres.thing == self)
			continue;	// don't clip against self

		int newdam = P_DamageMobj (cres.thing, self, self, 10001, NAME_Crush);
		P_TraceBleed (newdam > 0 ? newdam : 10001, cres.thing);
		self->args[1] = 1;	// Mark thrust thing as bloody
	}
	return 0;
}